

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto_test.cc
# Opt level: O2

void __thiscall
upb_test::FuzzTest_EnumValueNoNumber_Test::TestBody(FuzzTest_EnumValueNoNumber_Test *this)

{
  string_view text_proto;
  ParseTextProtoOrDie local_70;
  FileDescriptorSet local_50;
  
  text_proto._M_str =
       "file {\n             name: \"\\035\"\n             enum_type {\n               name: \"f\"\n               value { name: \"abc\" }\n             }\n           }"
  ;
  text_proto._M_len = 0x93;
  ParseTextProtoOrDie::ParseTextProtoOrDie(&local_70,text_proto);
  ParseTextProtoOrDie::operator_cast_to_FileDescriptorSet(&local_50,&local_70);
  RoundTripDescriptor(&local_50);
  google::protobuf::FileDescriptorSet::~FileDescriptorSet(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

TEST(FuzzTest, EnumValueNoNumber) {
  RoundTripDescriptor(ParseTextProtoOrDie(
      R"pb(file {
             name: "\035"
             enum_type {
               name: "f"
               value { name: "abc" }
             }
           })pb"));
}